

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogGetSystem(xmlChar *sysID)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  if (xmlCatalogGetSystem::msg == 0) {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"Use of deprecated xmlCatalogGetSystem() call\n");
    xmlCatalogGetSystem::msg = xmlCatalogGetSystem::msg + 1;
  }
  if ((sysID != (xmlChar *)0x0) && (xmlDefaultCatalog != (xmlCatalogPtr)0x0)) {
    pxVar4 = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml,(xmlChar *)0x0,sysID);
    if ((xmlChar *)0x1 < pxVar4 + 1) {
      snprintf((char *)xmlCatalogGetSystem::result,999,"%s",pxVar4);
      xmlCatalogGetSystem::result[999] = '\0';
      return xmlCatalogGetSystem::result;
    }
    if (xmlDefaultCatalog != (xmlCatalogPtr)0x0) {
      pxVar4 = xmlCatalogGetSGMLSystem(xmlDefaultCatalog->sgml,sysID);
      return pxVar4;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlCatalogGetSystem(const xmlChar *sysID) {
    xmlChar *ret;
    static xmlChar result[1000];
    static int msg = 0;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if (msg == 0) {
	xmlGenericError(xmlGenericErrorContext,
		"Use of deprecated xmlCatalogGetSystem() call\n");
	msg++;
    }

    if (sysID == NULL)
	return(NULL);

    /*
     * Check first the XML catalogs
     */
    if (xmlDefaultCatalog != NULL) {
	ret = xmlCatalogListXMLResolve(xmlDefaultCatalog->xml, NULL, sysID);
	if ((ret != NULL) && (ret != XML_CATAL_BREAK)) {
	    snprintf((char *) result, sizeof(result) - 1, "%s", (char *) ret);
	    result[sizeof(result) - 1] = 0;
	    return(result);
	}
    }

    if (xmlDefaultCatalog != NULL)
	return(xmlCatalogGetSGMLSystem(xmlDefaultCatalog->sgml, sysID));
    return(NULL);
}